

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

size_t __thiscall
std::hash<om::net::ip4_flow_key>::operator()(hash<om::net::ip4_flow_key> *this,ip4_flow_key *d_)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = CONCAT44((d_->_ip_src)._addr,(d_->_ip_dst)._addr);
  uVar2 = (ulong)d_->_ip_proto | (ulong)d_->_tp_dst << 8 | (ulong)d_->_tp_src << 0x18;
  return (uVar2 >> 2) + uVar1 * 0x40 + uVar2 + 0x9e3779b9 ^ uVar1;
}

Assistant:

inline std::size_t operator()(const om::net::ip4_flow_key& d_) const noexcept
		{
			// pack into two different long unsigned integers
			uint64_t a = 0, b = 0;
			a |= (uint64_t) d_.ip_src().to_uint32() << 32;
			a |= (uint64_t) d_.ip_dst().to_uint32() <<  0;
			b |= (uint64_t) d_.tp_src()             << 24;
			b |= (uint64_t) d_.tp_dst()             <<  8;
			b |= (uint64_t) d_.ip_proto()           <<  0;
			return ((size_t) a xor ((size_t) b + 0x9e3779b9 + (a << 6) + (b >> 2)));
		}